

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O1

BOOL __thiscall
Js::TypedArrayBase::SetPropertyWithAttributes
          (TypedArrayBase *this,PropertyId propertyId,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  ScriptContext *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint32 uVar1;
  int iVar2;
  BOOL BVar3;
  PropertyRecord *this_01;
  PropertyString *aValue;
  double local_50;
  double result;
  Var local_40;
  PropertyOperationFlags local_38;
  SideEffects local_31;
  
  local_31 = possibleSideEffects;
  this_00 = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).scriptContext.ptr;
  result = (double)info;
  local_40 = value;
  local_38 = flags;
  this_01 = ScriptContext::GetPropertyName(this_00,propertyId);
  if (this_01->isNumeric == true) {
    ArrayObject::VerifySetItemAttributes((ArrayObject *)this,propertyId,attributes);
    uVar1 = PropertyRecord::GetNumericValue(this_01);
    UNRECOVERED_JUMPTABLE =
         (this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
         super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
         _vptr_IRecyclerVisitedObject[0x29];
    iVar2 = (*UNRECOVERED_JUMPTABLE)(this,(ulong)uVar1,local_40,0,UNRECOVERED_JUMPTABLE);
    return iVar2;
  }
  if (this_01->isSymbol == false) {
    aValue = ScriptContext::GetPropertyString(this_00,propertyId);
    BVar3 = JavascriptConversion::CanonicalNumericIndexString
                      (&aValue->super_JavascriptString,&local_50,this_00);
    if (BVar3 != 0) {
      return 0;
    }
  }
  BVar3 = DynamicObject::SetPropertyWithAttributes
                    ((DynamicObject *)this,propertyId,local_40,attributes,
                     (PropertyValueInfo *)result,local_38,local_31);
  return BVar3;
}

Assistant:

BOOL TypedArrayBase::SetPropertyWithAttributes(PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        ScriptContext* scriptContext = GetScriptContext();

        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(propertyId);
        if (propertyRecord->IsNumeric())
        {
            VerifySetItemAttributes(propertyId, attributes);
            return SetItem(propertyRecord->GetNumericValue(), value);
        }

        if (!propertyRecord->IsSymbol() && CanonicalNumericIndexString(propertyId, scriptContext))
        {
            return FALSE;
        }

        return __super::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
    }